

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cpp
# Opt level: O2

bounded_buffer * peparse::splitBuffer(bounded_buffer *b,uint32_t from,uint32_t to)

{
  bounded_buffer *pbVar1;
  
  if ((from <= to && b != (bounded_buffer *)0x0) && (to <= b->bufLen)) {
    pbVar1 = (bounded_buffer *)operator_new(0x18,(nothrow_t *)&std::nothrow);
    if (pbVar1 != (bounded_buffer *)0x0) {
      pbVar1->detail = (buffer_detail *)0x0;
      pbVar1->buf = (uint8_t *)0x0;
      pbVar1->bufLen = 0;
      pbVar1->copy = false;
      pbVar1->swapBytes = false;
      *(undefined2 *)&pbVar1->field_0xe = 0;
      pbVar1->copy = true;
      pbVar1->buf = b->buf + from;
      pbVar1->bufLen = to - from;
      return pbVar1;
    }
  }
  return (bounded_buffer *)0x0;
}

Assistant:

bounded_buffer *
splitBuffer(bounded_buffer *b, std::uint32_t from, std::uint32_t to) {
  if (b == nullptr) {
    return nullptr;
  }

  // safety checks
  if (to < from || to > b->bufLen) {
    return nullptr;
  }

  // make a new buffer
  auto newBuff = new (std::nothrow) bounded_buffer();
  if (newBuff == nullptr) {
    return nullptr;
  }

  newBuff->copy = true;
  newBuff->buf = b->buf + from;
  newBuff->bufLen = (to - from);

  return newBuff;
}